

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

int lupdate(lua_State *L)

{
  int iVar1;
  char *__src;
  char *tmp;
  size_t sz;
  void *msg;
  boxstm *box;
  lua_State *L_local;
  
  box = (boxstm *)L;
  msg = lua_touserdata(L,1);
  iVar1 = lua_isuserdata((lua_State *)box,2);
  if (iVar1 == 0) {
    __src = luaL_checklstring((lua_State *)box,2,(size_t *)&tmp);
    sz = (size_t)malloc((size_t)tmp);
    memcpy((void *)sz,__src,(size_t)tmp);
  }
  else {
    sz = (size_t)lua_touserdata((lua_State *)box,2);
    tmp = (char *)luaL_checkinteger((lua_State *)box,3);
  }
  stm_update(*msg,(void *)sz,(int32_t)tmp);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	void * msg;
	size_t sz;
	if (lua_isuserdata(L, 2)) {
		msg = lua_touserdata(L, 2);
		sz = (size_t)luaL_checkinteger(L, 3);
	} else {
		const char * tmp = luaL_checklstring(L,2,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	stm_update(box->obj, msg, sz);

	return 0;
}